

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::SocketWriter::CloseConnection(SocketWriter *this)

{
  bool bVar1;
  ostream *poVar2;
  GTestLog local_14;
  SocketWriter *local_10;
  SocketWriter *this_local;
  
  local_10 = this;
  bVar1 = IsTrue(this->sockfd_ != -1);
  if (!bVar1) {
    GTestLog::GTestLog(&local_14,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/gtest/src/gtest-internal-inl.h"
                       ,0x461);
    poVar2 = GTestLog::GetStream(&local_14);
    poVar2 = std::operator<<(poVar2,"Condition sockfd_ != -1 failed. ");
    std::operator<<(poVar2,"CloseConnection() can be called only when there is a connection.");
    GTestLog::~GTestLog(&local_14);
  }
  close(this->sockfd_);
  this->sockfd_ = -1;
  return;
}

Assistant:

void CloseConnection() {
      GTEST_CHECK_(sockfd_ != -1)
          << "CloseConnection() can be called only when there is a connection.";

      close(sockfd_);
      sockfd_ = -1;
    }